

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

unsigned_long
beast::lexicalCastThrow<unsigned_long,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  bool bVar1;
  BadLexicalCast *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  unsigned_long local_18;
  unsigned_long out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_local;
  
  out = (unsigned_long)in;
  std::__cxx11::string::string((string *)&local_38,(string *)in);
  bVar1 = lexicalCastChecked<unsigned_long,std::__cxx11::string>(&local_18,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar1) {
    this = (BadLexicalCast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    BadLexicalCast::BadLexicalCast(this);
    __cxa_throw(this,&BadLexicalCast::typeinfo,BadLexicalCast::~BadLexicalCast);
  }
  return local_18;
}

Assistant:

Out lexicalCastThrow (In in)
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    throw BadLexicalCast ();
}